

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString ON_SubDHashTypeToString(ON_SubDHashType subd_hash_type,bool bVerbose)

{
  byte in_DL;
  undefined7 in_register_00000039;
  ON_wString *this;
  ON_wString local_38;
  byte local_29;
  ON_wString local_28;
  wchar_t *local_20;
  wchar_t *name;
  bool bVerbose_local;
  ON_wString *pOStack_10;
  ON_SubDHashType subd_hash_type_local;
  
  this = (ON_wString *)CONCAT71(in_register_00000039,subd_hash_type);
  name._6_1_ = in_DL & 1;
  switch(bVerbose) {
  case false:
    local_20 = L"Unset";
    break;
  case true:
    local_20 = L"TopologyAndEdgeCreases";
    break;
  case true:
    local_20 = L"Geometry";
    break;
  case true:
    local_20 = L"Topology";
    break;
  default:
    local_20 = L"invalid";
  }
  local_29 = 0;
  name._7_1_ = bVerbose;
  pOStack_10 = this;
  if (name._6_1_ == 0) {
    ON_wString::ON_wString(this,local_20);
  }
  else {
    ON_wString::ON_wString(&local_28,L"ON_SubDHashType::");
    local_29 = 1;
    ON_wString::ON_wString(&local_38,local_20);
    ON_wString::operator+(this,&local_28);
    ON_wString::~ON_wString(&local_38);
  }
  if ((local_29 & 1) != 0) {
    ON_wString::~ON_wString(&local_28);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDHashTypeToString(
  ON_SubDHashType subd_hash_type,
  bool bVerbose
)
{
  const wchar_t* name;
  switch (subd_hash_type)
  {
  case ON_SubDHashType::Unset:
    name = L"Unset";
    break;
  case ON_SubDHashType::Topology:
    name = L"Topology";
    break;
  case ON_SubDHashType::TopologyAndEdgeCreases:
    name = L"TopologyAndEdgeCreases";
    break;
  case ON_SubDHashType::Geometry:
    name = L"Geometry";
    break;
  default:
    name = L"invalid";
    break;
  }

  return bVerbose ? (ON_wString(L"ON_SubDHashType::") + ON_wString(name)) : ON_wString(name);
}